

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::SurfaceAttribPbufferCase::executeForConfig
          (SurfaceAttribPbufferCase *this,EGLDisplay display,EGLConfig config)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  deUint32 err;
  EGLint EVar3;
  EGLint EVar4;
  int iVar5;
  Library *egl;
  undefined4 extraout_var;
  int iVar6;
  UniqueSurface surface;
  EGLint attribs [7];
  ConfigInfo info;
  UniqueSurface local_260;
  undefined1 local_248 [384];
  ConfigInfo local_c8;
  
  egl = EglTestContext::getLibrary
                  ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.
                   m_eglTestCtx);
  pTVar2 = ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_c8.transparentRedValue = 0;
  local_c8.transparentGreenValue = 0;
  local_c8.transparentBlueValue = 0;
  local_c8.samples = 0;
  local_c8.stencilSize = 0;
  local_c8.surfaceType = 0;
  local_c8.transparentType = 0;
  local_c8.nativeVisualId = 0;
  local_c8.nativeVisualType = 0;
  local_c8.renderableType = 0;
  local_c8.sampleBuffers = 0;
  local_c8.maxPbufferHeight = 0;
  local_c8.maxSwapInterval = 0;
  local_c8.minSwapInterval = 0;
  local_c8.nativeRenderable = 0;
  local_c8.conformant = 0;
  local_c8.depthSize = 0;
  local_c8.level = 0;
  local_c8.maxPbufferWidth = 0;
  local_c8.bindToTextureRGBA = 0;
  local_c8.colorBufferType = 0;
  local_c8.configCaveat = 0;
  local_c8.configId = 0;
  local_c8.luminanceSize = 0;
  local_c8.alphaSize = 0;
  local_c8.alphaMaskSize = 0;
  local_c8.bindToTextureRGB = 0;
  local_c8.bufferSize = 0;
  local_c8.redSize = 0;
  local_c8.greenSize = 0;
  local_c8.blueSize = 0;
  local_c8.yuvOrder = 0x3038;
  local_c8.yuvNumberOfPlanes = 0;
  local_c8.yuvSubsample = 0x3038;
  local_c8.yuvDepthRange = 0x3038;
  local_c8.yuvCscStandard = 0x3038;
  local_c8.yuvPlaneBpp = 0x331b;
  local_c8.colorComponentType = 0x3038;
  eglu::queryCoreConfigInfo(egl,display,config,&local_c8);
  poVar1 = (ostringstream *)(local_248 + 8);
  local_248._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Creating pbuffer surface with config ID ",0x28);
  std::ostream::operator<<(poVar1,local_c8.configId);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_248 + 0x78));
  err = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(err,"before queries",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQuerySurfaceTests.cpp"
                   ,0x285);
  EVar3 = eglu::getConfigAttribInt(egl,display,config,0x302c);
  iVar5 = 0x40;
  if (EVar3 < 0x40) {
    iVar5 = EVar3;
  }
  EVar4 = eglu::getConfigAttribInt(egl,display,config,0x302a);
  iVar6 = 0x40;
  if (EVar4 < 0x40) {
    iVar6 = EVar4;
  }
  if (EVar3 == 0 || EVar4 == 0) {
    poVar1 = (ostringstream *)(local_248 + 8);
    local_248._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"    Fail, maximum pbuffer size of ",0x22);
    std::ostream::operator<<(poVar1,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," reported",9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_248 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_SurfaceAttribCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Invalid maximum pbuffer size");
  }
  else {
    local_248._4_4_ = iVar5;
    local_248._0_4_ = 0x3057;
    local_248._8_4_ = 0x3056;
    local_248._16_8_ = 0x305c00003080;
    local_248._24_4_ = 0x3038;
    local_248._12_4_ = iVar6;
    iVar5 = (*egl->_vptr_Library[10])(egl,display,config);
    eglu::UniqueSurface::UniqueSurface
              (&local_260,egl,display,(EGLSurface)CONCAT44(extraout_var,iVar5));
    SurfaceAttribCase::testAttributes
              (&this->super_SurfaceAttribCase,display,local_260.m_surface,1,&local_c8);
    eglu::UniqueSurface::~UniqueSurface(&local_260);
  }
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		tcu::TestLog&	log		= m_testCtx.getLog();
		int				width	= 64;
		int				height	= 64;
		ConfigInfo		info;

		eglu::queryCoreConfigInfo(egl, display, config, &info);

		log << TestLog::Message << "Creating pbuffer surface with config ID " << info.configId << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "before queries");

		// Clamp to maximums reported by implementation
		width	= deMin32(width, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_WIDTH));
		height	= deMin32(height, eglu::getConfigAttribInt(egl, display, config, EGL_MAX_PBUFFER_HEIGHT));

		if (width == 0 || height == 0)
		{
			log << TestLog::Message << "    Fail, maximum pbuffer size of " << width << "x" << height << " reported" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid maximum pbuffer size");
			return;
		}

		const EGLint attribs[] =
		{
			EGL_WIDTH,			width,
			EGL_HEIGHT,			height,
			EGL_TEXTURE_FORMAT,	EGL_NO_TEXTURE,
			EGL_NONE
		};

		eglu::UniqueSurface surface(egl, display, egl.createPbufferSurface(display, config, attribs));

		testAttributes(display, *surface, EGL_PBUFFER_BIT, info);
	}